

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> __thiscall
slang::ast::RandSeqProductionSymbol::getRules(RandSeqProductionSymbol *this)

{
  SyntaxNode *this_00;
  size_type sVar1;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> this_01;
  int iVar2;
  ProductionSyntax *pPVar3;
  RsRuleSyntax *syntax;
  StatementBlockSymbol *ruleBlock;
  Compilation *dst;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> tmp;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
  iVar4;
  LookupLocation lookupLocation;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> blockIt;
  const_iterator __begin3;
  ASTContext context;
  SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> buffer;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_328;
  iterator_base<const_slang::syntax::RsRuleSyntax_*> local_320;
  RandSeqProductionSymbol *local_310;
  ASTContext local_308;
  Rule local_2d0;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> local_288 [6];
  
  if ((this->rules).
      super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
      ._M_engaged == false) {
    this_00 = (this->super_Symbol).originatingSyntax;
    if (this_00 == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x53f,
                 "span<const RandSeqProductionSymbol::Rule> slang::ast::RandSeqProductionSymbol::getRules() const"
                );
    }
    lookupLocation._12_4_ = 0;
    lookupLocation.scope = (Scope *)SUB128(ZEXT412(0xffffffff) << 0x40,0);
    lookupLocation.index = SUB124(ZEXT412(0xffffffff) << 0x40,8);
    local_310 = this;
    ASTContext::ASTContext
              (&local_308,&this->super_Scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x0);
    iVar4 = Scope::membersOfType<slang::ast::StatementBlockSymbol>(&this->super_Scope);
    local_328 = iVar4.m_begin.current;
    local_288[0].data_ = (pointer)local_288[0].firstElement;
    local_288[0].len = 0;
    local_288[0].cap = 8;
    pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ProductionSyntax>(this_00);
    local_320.index = 0;
    sVar1 = (pPVar3->rules).elements.size_;
    local_320.list = &pPVar3->rules;
    for (; (local_320.list != &pPVar3->rules || (local_320.index != sVar1 + 1 >> 1));
        local_320.index = local_320.index + 1) {
      syntax = slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::
               iterator_base<const_slang::syntax::RsRuleSyntax_*>::operator*(&local_320);
      this_01.current = local_328.current;
      if (local_328.current == iVar4.m_end.current.current) {
        assert::assertFailed
                  ("blockIt != blocks.end()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,0x548,
                   "span<const RandSeqProductionSymbol::Rule> slang::ast::RandSeqProductionSymbol::getRules() const"
                  );
      }
      Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator++(&local_328);
      ruleBlock = Symbol::as<slang::ast::StatementBlockSymbol>(this_01.current);
      createRule(&local_2d0,syntax,&local_308,ruleBlock);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
      emplace_back<slang::ast::RandSeqProductionSymbol::Rule>(local_288,&local_2d0);
    }
    dst = ASTContext::getCompilation(&local_308);
    iVar2 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::copy
                      (local_288,(EVP_PKEY_CTX *)dst,src);
    this = local_310;
    if ((local_310->rules).
        super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
        ._M_engaged == false) {
      (local_310->rules).
      super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
      ._M_engaged = true;
    }
    (local_310->rules).
    super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ._M_payload._M_value.data_ = (pointer)CONCAT44(extraout_var,iVar2);
    (local_310->rules).
    super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ._M_payload._M_value.size_ = extraout_RDX;
    SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::~SmallVectorBase(local_288);
  }
  return (this->rules).
         super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
         ._M_payload._M_value;
}

Assistant:

span<const RandSeqProductionSymbol::Rule> RandSeqProductionSymbol::getRules() const {
    if (!rules) {
        auto syntax = getSyntax();
        ASSERT(syntax);

        ASTContext context(*this, LookupLocation::max);

        auto blocks = membersOfType<StatementBlockSymbol>();
        auto blockIt = blocks.begin();

        SmallVector<Rule, 8> buffer;
        for (auto rule : syntax->as<ProductionSyntax>().rules) {
            ASSERT(blockIt != blocks.end());
            buffer.push_back(createRule(*rule, context, *blockIt++));
        }

        rules = buffer.copy(context.getCompilation());
    }
    return *rules;
}